

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  runtime_error *this_00;
  uint in_ESI;
  Value *in_RDI;
  ArrayIndex index;
  ArrayIndex oldSize;
  ArrayIndex in_stack_00000064;
  Value *in_stack_00000068;
  Value *in_stack_ffffffffffffff78;
  key_type *__x;
  Value *in_stack_ffffffffffffff80;
  CZString *this_01;
  Value *in_stack_ffffffffffffff90;
  CZString local_60;
  undefined4 in_stack_ffffffffffffffb0;
  ArrayIndex index_00;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_48 [60];
  uint local_c;
  
  if (((*(ushort *)&in_RDI->field_0x8 & 0xff) != 0) && ((*(ushort *)&in_RDI->field_0x8 & 0xff) != 6)
     ) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"in Json::Value::resize(): requires arrayValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c = in_ESI;
  if ((*(ushort *)&in_RDI->field_0x8 & 0xff) == 0) {
    Value(in_stack_ffffffffffffff90,(ValueType)((ulong)local_48 >> 0x20));
    operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ~Value((Value *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  AVar1 = size(in_RDI);
  if (local_c == 0) {
    clear(in_stack_ffffffffffffff90);
  }
  else {
    index_00 = local_c;
    if (AVar1 < local_c) {
      operator[](in_stack_00000068,in_stack_00000064);
    }
    else {
      for (; index_00 < AVar1; index_00 = index_00 + 1) {
        __x = (key_type *)(in_RDI->value_).map_;
        this_01 = &local_60;
        CZString::CZString(this_01,index_00);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::erase((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 *)this_01,__x);
        CZString::~CZString(this_01);
      }
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
#else
  value_.array_->resize(newSize);
#endif
}